

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,char *context_string)

{
  ptls_async_job_t **pppVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  ptls_buffer_t *buf_00;
  size_t sVar3;
  st_ptls_sign_certificate_t *psVar4;
  ptls_iovec_t pVar5;
  int iVar6;
  ptls_async_job_t **pppVar7;
  ulong uVar8;
  long lVar9;
  ptls_async_job_t **pppVar10;
  size_t sVar11;
  ptls_hash_context_t **pppVar12;
  size_t sVar13;
  uint8_t *puVar14;
  uint16_t algo;
  uint8_t data [226];
  uint8_t local_172;
  uint8_t local_171;
  ptls_buffer_t *local_170;
  size_t local_168;
  size_t local_160;
  ptls_buffer_t *local_158;
  size_t local_150;
  size_t local_148;
  ptls_key_schedule_t *local_140;
  size_t local_138;
  st_ptls_signature_algorithms_t *local_130;
  uint8_t *local_128;
  size_t sStack_120;
  uint8_t local_118 [232];
  
  if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
    iVar6 = 0;
  }
  else {
    sVar11 = emitter->buf->off;
    iVar6 = (*emitter->begin_message)(emitter);
    if (iVar6 == 0) {
      buf = emitter->buf;
      ppVar2 = tls->key_schedule;
      sVar13 = buf->off;
      local_138 = sVar11;
      local_130 = signature_algorithms;
      iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
      if (iVar6 == 0) {
        buf->base[buf->off] = '\x0f';
        buf->off = buf->off + 1;
        local_148 = sVar13;
        local_140 = ppVar2;
        iVar6 = ptls_buffer_reserve_aligned(buf,3,'\0');
        if (iVar6 == 0) {
          puVar14 = buf->base;
          sVar11 = buf->off;
          puVar14[sVar11 + 2] = '\0';
          puVar14 = puVar14 + sVar11;
          puVar14[0] = '\0';
          puVar14[1] = '\0';
          sVar13 = buf->off;
          sVar11 = sVar13 + 3;
          buf->off = sVar11;
          buf_00 = emitter->buf;
          local_150 = buf_00->off;
          local_158 = buf;
          iVar6 = ptls_buffer_reserve_aligned(buf_00,2,'\0');
          if (iVar6 == 0) {
            puVar14 = buf_00->base;
            sVar3 = buf_00->off;
            (puVar14 + sVar3)[0] = '\0';
            (puVar14 + sVar3)[1] = '\0';
            buf_00->off = buf_00->off + 2;
            local_168 = sVar13;
            local_160 = sVar11;
            iVar6 = ptls_buffer_reserve_aligned(buf_00,2,'\0');
            if (iVar6 == 0) {
              puVar14 = buf_00->base;
              sVar11 = buf_00->off;
              (puVar14 + sVar11)[0] = '\0';
              (puVar14 + sVar11)[1] = '\0';
              sVar11 = buf_00->off;
              buf_00->off = sVar11 + 2;
              local_170 = buf_00;
              sStack_120 = build_certificate_verify_signdata
                                     (local_118,tls->key_schedule,context_string);
              psVar4 = tls->ctx->sign_certificate;
              pppVar7 = (ptls_async_job_t **)0x0;
              pppVar1 = &(tls->field_19).server.async_job;
              pppVar10 = pppVar1;
              if ((tls->field_0x1e8 & 1) == 0) {
                pppVar10 = pppVar7;
              }
              if (local_130 != (st_ptls_signature_algorithms_t *)0x0) {
                pppVar7 = (ptls_async_job_t **)local_130->count;
              }
              pVar5.len = sStack_120;
              pVar5.base = local_118;
              local_128 = local_118;
              iVar6 = (*psVar4->cb)(psVar4,tls,pppVar10,(uint16_t *)&local_172,local_170,pVar5,
                                    local_130->list,(size_t)pppVar7);
              ppVar2 = local_140;
              if (iVar6 == 0) {
                if (*pppVar1 != (ptls_async_job_t *)0x0) {
                  __assert_fail("tls->server.async_job == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0xc92,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                local_170->base[local_150] = local_171;
                local_170->base[local_150 + 1] = local_172;
                uVar8 = local_170->off - (sVar11 + 2);
                iVar6 = 0x20c;
                if (uVar8 < 0x10000) {
                  local_170->base[sVar11] = (uint8_t)(uVar8 >> 8);
                  local_170->base[sVar11 + 1] = (uint8_t)uVar8;
                  uVar8 = local_158->off - local_160;
                  if (uVar8 < 0x1000000) {
                    lVar9 = 0x10;
                    sVar11 = local_168;
                    do {
                      local_158->base[sVar11] = (uint8_t)(uVar8 >> ((byte)lVar9 & 0x3f));
                      lVar9 = lVar9 + -8;
                      sVar11 = sVar11 + 1;
                    } while (lVar9 != -8);
                    if ((local_140 != (ptls_key_schedule_t *)0x0) && (local_140->num_hashes != 0)) {
                      puVar14 = local_158->base + local_148;
                      sVar13 = local_158->off - local_148;
                      pppVar12 = &local_140->hashes[0].ctx;
                      sVar11 = 0;
                      do {
                        (*(*pppVar12)->update)(*pppVar12,puVar14,sVar13);
                        sVar11 = sVar11 + 1;
                        pppVar12 = pppVar12 + 3;
                      } while (sVar11 != ppVar2->num_hashes);
                    }
                    iVar6 = (*emitter->commit_message)(emitter);
                  }
                }
              }
              else if (iVar6 == 0x20b) {
                if ((tls->field_0x1e8 & 1) == 0) {
                  __assert_fail("tls->is_server || !\"async operation only supported on the server-side\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0xc88,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                if (*pppVar1 == (ptls_async_job_t *)0x0) {
                  __assert_fail("tls->server.async_job != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0xc89,
                                "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                               );
                }
                emitter->buf->off = local_138;
              }
              else if (*pppVar1 != (ptls_async_job_t *)0x0) {
                __assert_fail("tls->server.async_job == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                              ,0xc8e,
                              "int send_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, const char *)"
                             );
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int send_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms, const char *context_string)
{
    size_t start_off = emitter->buf->off;
    int ret;

    if (tls->ctx->sign_certificate == NULL)
        return 0;
    /* build and send CertificateVerify */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
        ptls_buffer_t *sendbuf = emitter->buf;
        size_t algo_off = sendbuf->off;
        ptls_buffer_push16(sendbuf, 0); /* filled in later */
        ptls_buffer_push_block(sendbuf, 2, {
            uint16_t algo;
            uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
            if ((ret = tls->ctx->sign_certificate->cb(
                     tls->ctx->sign_certificate, tls, tls->is_server ? &tls->server.async_job : NULL, &algo, sendbuf,
                     ptls_iovec_init(data, datalen), signature_algorithms != NULL ? signature_algorithms->list : NULL,
                     signature_algorithms != NULL ? signature_algorithms->count : 0)) != 0) {
                if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                    assert(tls->is_server || !"async operation only supported on the server-side");
                    assert(tls->server.async_job != NULL);
                    /* Reset the output to the end of the previous handshake message. CertificateVerify will be rebuilt when the
                     * async operation completes. */
                    emitter->buf->off = start_off;
                } else {
                    assert(tls->server.async_job == NULL);
                }
                goto Exit;
            }
            assert(tls->server.async_job == NULL);
            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
            sendbuf->base[algo_off + 1] = (uint8_t)algo;
        });
    });
Exit:
    return ret;
}